

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O3

void __thiscall GLRParser::toDot(GLRParser *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Production *this_00;
  pointer pbVar4;
  string *label;
  long lVar5;
  bool bVar6;
  long *plVar7;
  string *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr p_Var12;
  size_type *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  pointer pbVar14;
  string stateLable;
  string stateTo;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  string local_2b8;
  Graph local_298;
  string *local_248;
  _Base_ptr local_240;
  _Base_ptr local_238;
  string local_230;
  string local_210;
  Connection local_1f0;
  Node local_190;
  Connection local_110;
  Node local_b0;
  
  local_298.rankdir._M_dataplus._M_p = (pointer)&local_298.rankdir.field_2;
  local_298.rankdir._M_string_length = 0;
  local_298.rankdir.field_2._8_8_ = 0;
  local_298.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_298.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.rankdir.field_2._M_allocated_capacity = 0;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"TB","");
  Graph::setRankdir(&local_298,&local_300);
  local_248 = filename;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  p_Var12 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240 = &(this->states)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var12 != local_240) {
    do {
      local_2c0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (p_Var12 + 1);
      std::operator+(&local_2e0,"{",local_2c0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar13 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_300.field_2._M_allocated_capacity = *psVar13;
        local_300.field_2._8_8_ = plVar7[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar13;
        local_300._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_300._M_string_length = plVar7[1];
      *plVar7 = (long)psVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_238 = p_Var12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      p_Var10 = (_Rb_tree_node_base *)local_2c0[3].field_2._M_allocated_capacity;
      p_Var11 = (_Rb_tree_node_base *)(local_2c0 + 3);
      if (p_Var10 != p_Var11) {
        bVar6 = true;
        do {
          this_00 = *(Production **)(p_Var10 + 1);
          if (!bVar6) {
            std::__cxx11::string::append((char *)&local_300);
          }
          psVar8 = Production::getFromP_abi_cxx11_(this_00);
          std::__cxx11::string::_M_append((char *)&local_300,(ulong)(psVar8->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_300);
          pvVar9 = Production::getToP_abi_cxx11_(this_00);
          pbVar4 = (pvVar9->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar14 = (pvVar9->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
              pbVar14 = pbVar14 + 1) {
            std::__cxx11::string::_M_append((char *)&local_300,(ulong)(pbVar14->_M_dataplus)._M_p);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          bVar6 = false;
        } while (p_Var10 != p_Var11);
      }
      if (*(char *)&local_2c0[1]._M_dataplus._M_p != '\0') {
        std::__cxx11::string::append((char *)&local_300);
      }
      std::__cxx11::string::append((char *)&local_300);
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Mrecord","");
      Node::Node(&local_190,local_2c0,&local_300,&local_2e0);
      Graph::addNode(&local_298,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.extra._M_dataplus._M_p != &local_190.extra.field_2) {
        operator_delete(local_190.extra._M_dataplus._M_p,
                        local_190.extra.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.shape._M_dataplus._M_p != &local_190.shape.field_2) {
        operator_delete(local_190.shape._M_dataplus._M_p,
                        local_190.shape.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.label._M_dataplus._M_p != &local_190.label.field_2) {
        operator_delete(local_190.label._M_dataplus._M_p,
                        local_190.label.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
        operator_delete(local_190.name._M_dataplus._M_p,
                        local_190.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_2c0 + 4;
      for (p_Var11 = (_Rb_tree_node_base *)local_2c0[5]._M_dataplus._M_p;
          p_Var11 != (_Rb_tree_node_base *)&psVar8->field_2;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        label = *(string **)(p_Var11 + 1);
        plVar7 = (long *)label[1]._M_dataplus._M_p;
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        lVar5 = *plVar7;
        std::__cxx11::string::_M_construct<char*>((string *)&local_2e0,lVar5,plVar7[1] + lVar5);
        Connection::Connection(&local_1f0,local_2c0,&local_2e0,label);
        Graph::addConnection(&local_298,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.label._M_dataplus._M_p != &local_1f0.label.field_2) {
          operator_delete(local_1f0.label._M_dataplus._M_p,
                          local_1f0.label.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.name_to._M_dataplus._M_p != &local_1f0.name_to.field_2) {
          operator_delete(local_1f0.name_to._M_dataplus._M_p,
                          local_1f0.name_to.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.name_from._M_dataplus._M_p != &local_1f0.name_from.field_2) {
          operator_delete(local_1f0.name_from._M_dataplus._M_p,
                          local_1f0.name_from.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_238);
    } while (p_Var12 != local_240);
  }
  paVar1 = &local_300.field_2;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"invis","");
  paVar2 = &local_2e0.field_2;
  local_2e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"invis","");
  paVar3 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"circle","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"style=invis","");
  Node::Node(&local_b0,&local_300,&local_2e0,&local_2b8,&local_210);
  Graph::addNode(&local_298,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.extra._M_dataplus._M_p != &local_b0.extra.field_2) {
    operator_delete(local_b0.extra._M_dataplus._M_p,local_b0.extra.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.shape._M_dataplus._M_p != &local_b0.shape.field_2) {
    operator_delete(local_b0.shape._M_dataplus._M_p,local_b0.shape.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.label._M_dataplus._M_p != &local_b0.label.field_2) {
    operator_delete(local_b0.label._M_dataplus._M_p,local_b0.label.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
    operator_delete(local_b0.name._M_dataplus._M_p,local_b0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"invis","");
  startStateName_abi_cxx11_();
  local_2b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Start","");
  Connection::Connection(&local_110,&local_300,&local_2e0,&local_2b8);
  Graph::addConnection(&local_298,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.label._M_dataplus._M_p != &local_110.label.field_2) {
    operator_delete(local_110.label._M_dataplus._M_p,
                    local_110.label.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name_to._M_dataplus._M_p != &local_110.name_to.field_2) {
    operator_delete(local_110.name_to._M_dataplus._M_p,
                    local_110.name_to.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name_from._M_dataplus._M_p != &local_110.name_from.field_2) {
    operator_delete(local_110.name_from._M_dataplus._M_p,
                    local_110.name_from.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  psVar8 = local_248;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (psVar8->_M_dataplus)._M_p;
  paVar1 = &psVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p == paVar1) {
    local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_230.field_2._8_8_ = *(undefined8 *)((long)&psVar8->field_2 + 8);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  }
  else {
    local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_230._M_string_length = psVar8->_M_string_length;
  (psVar8->_M_dataplus)._M_p = (pointer)paVar1;
  psVar8->_M_string_length = 0;
  (psVar8->field_2)._M_local_buf[0] = '\0';
  Graph::build_file(&local_298,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.rankdir._M_dataplus._M_p != &local_298.rankdir.field_2) {
    operator_delete(local_298.rankdir._M_dataplus._M_p,
                    local_298.rankdir.field_2._M_allocated_capacity + 1);
  }
  std::vector<Connection,_std::allocator<Connection>_>::~vector(&local_298.connections);
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_298.nodes);
  return;
}

Assistant:

void GLRParser::toDot(std::string filename) {
    Graph graph = Graph();
    graph.setRankdir("TB");
    for (auto state: states) {
        // TODO: getProductions()
        std::string stateLable = "{" + state->getName() + "|";
        bool firstElem = true;
        for (auto prod: state->getProductions()) {
            if (!firstElem) { stateLable += "\\n"; }
            firstElem = false;

            stateLable += prod->getFromP();
            stateLable += " -\\> ";
            for (const auto &el: prod->getToP()) {
                stateLable += el;
            }
        }

        if (state->isAccepting()) {
            stateLable += "|accepting state";
        }

        stateLable += "}";
        graph.addNode(Node(state->getName(), stateLable, "Mrecord"));

        for (auto transition: state->getStatesTo()) {
            const std::string &connectionString = transition->getLabel();
            std::string stateTo = transition->getStateTo()->getName();
            graph.addConnection(Connection(state->getName(), stateTo,
                                           connectionString));
        }
    }


    graph.addNode(Node("invis", "invis", "circle", "style=invis"));
    graph.addConnection(Connection("invis", startStateName(), "Start"));
    graph.build_file(std::move(filename));
}